

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kstring.h
# Opt level: O2

int kputc_(int c,kstring_t *s)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  size_t __size;
  
  uVar1 = s->l;
  uVar3 = uVar1 + 1;
  if (s->m < uVar3) {
    uVar1 = uVar1 >> 1 | uVar1;
    uVar1 = uVar1 >> 2 | uVar1;
    uVar1 = uVar1 >> 4 | uVar1;
    uVar1 = uVar1 >> 8 | uVar1;
    __size = (uVar1 >> 0x10 | uVar1) + 1;
    s->m = __size;
    pcVar2 = (char *)realloc(s->s,__size);
    if (pcVar2 == (char *)0x0) {
      return -1;
    }
    s->s = pcVar2;
    uVar1 = s->l;
    uVar3 = uVar1 + 1;
  }
  else {
    pcVar2 = s->s;
  }
  s->l = uVar3;
  pcVar2[uVar1] = (char)c;
  return 1;
}

Assistant:

static inline int kputc_(int c, kstring_t *s)
{
	if (s->l + 1 > s->m) {
		char *tmp;
		s->m = s->l + 1;
		kroundup32(s->m);
		if ((tmp = (char*)realloc(s->s, s->m)))
			s->s = tmp;
		else
			return EOF;
	}
	s->s[s->l++] = c;
	return 1;
}